

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::FieldDef::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDef *this)

{
  FieldTypeEnum field_type;
  FieldEncodingEnum field_encoding;
  string sStack_1b8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,this->fid_);
  std::operator+(&local_158,"fieldDef(FID=",&local_38);
  std::operator+(&local_138,&local_158,", name=\"");
  std::operator+(&local_118,&local_138,&this->name_);
  std::operator+(&local_f8,&local_118,"\", type=");
  FieldTypeMethods::ToString_abi_cxx11_
            (&local_178,(FieldTypeMethods *)(ulong)this->type_,field_type);
  std::operator+(&local_d8,&local_f8,&local_178);
  std::operator+(&local_b8,&local_d8,", encoding=");
  FieldEncodingMethods::ToString_abi_cxx11_
            (&local_198,(FieldEncodingMethods *)(ulong)this->encoding_,field_encoding);
  std::operator+(&local_98,&local_b8,&local_198);
  std::operator+(&local_78,&local_98,", scale=");
  std::__cxx11::to_string(&sStack_1b8,this->scale_);
  std::operator+(&local_58,&local_78,&sStack_1b8);
  std::operator+(__return_storage_ptr__,&local_58,')');
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDef::ToString() const
{
    return std::string("fieldDef(FID=" + std::to_string(fid_) +
                       ", name=\"" + name_ + "\", type=" + FieldTypeMethods::ToString(type_) + ", encoding="
                       + FieldEncodingMethods::ToString(encoding_) + ", scale=" + std::to_string(scale_) + ')'
    );
}